

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O2

void AVSInterface::RegisterFilter<MiniDeen>(IScriptEnvironment *env)

{
  MiniDeen filter;
  string local_e8;
  MiniDeen local_c8;
  
  MiniDeen::MiniDeen(&local_c8);
  Filter::AVSParams_abi_cxx11_(&local_e8,&local_c8.super_Filter);
  (**(code **)(*(long *)env + 0x38))
            (env,"neo_minideen",local_e8._M_dataplus._M_p,Create<MiniDeen>,0);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void RegisterFilter(IScriptEnvironment* env) {
    FilterType filter;
    env->AddFunction(filter.AVSName(), filter.AVSParams().c_str(), Create<FilterType>, nullptr);
  }